

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLValidator.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLValidator::emitError(XMLValidator *this,Codes toEmit)

{
  XMLErrorReporter *pXVar1;
  bool bVar2;
  ErrTypes EVar3;
  Codes *pCVar4;
  undefined1 local_848 [8];
  LastExtEntityInfo lastInfo;
  XMLCh errText [1024];
  XMLSize_t msgSize;
  Codes toEmit_local;
  XMLValidator *this_local;
  
  EVar3 = XMLValid::errorType(toEmit);
  if (EVar3 != ErrType_Warning) {
    XMLScanner::incrementErrorCount(this->fScanner);
  }
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    (**(code **)(*sMsgLoader + 0x10))(sMsgLoader,toEmit,&lastInfo.colNumber,0x3ff);
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)local_848);
    ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,(LastExtEntityInfo *)local_848);
    pXVar1 = this->fErrorReporter;
    EVar3 = XMLValid::errorType(toEmit);
    (*pXVar1->_vptr_XMLErrorReporter[2])
              (pXVar1,(ulong)toEmit,XMLUni::fgValidityDomain,(ulong)EVar3,&lastInfo.colNumber,
               local_848,lastInfo.systemId,lastInfo.publicId,lastInfo.lineNumber);
  }
  bVar2 = XMLValid::isError(toEmit);
  if ((((bVar2) && (bVar2 = XMLScanner::getValidationConstraintFatal(this->fScanner), bVar2)) ||
      (bVar2 = XMLValid::isFatal(toEmit), bVar2)) &&
     ((bVar2 = XMLScanner::getExitOnFirstFatal(this->fScanner), bVar2 &&
      (bVar2 = XMLScanner::getInException(this->fScanner), !bVar2)))) {
    pCVar4 = (Codes *)__cxa_allocate_exception(4);
    *pCVar4 = toEmit;
    __cxa_throw(pCVar4,&XMLValid::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XMLValidator::emitError(const XMLValid::Codes toEmit)
{
    // Bump the error count if it is not a warning
    if (XMLValid::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
        fScanner->incrementErrorCount();

    //	Call error reporter if we have one
    if (fErrorReporter)
    {
        // Load the message into a local for display
        const XMLSize_t msgSize = 1023;
        XMLCh errText[msgSize + 1];

        // load the text
        if (!sMsgLoader->loadMsg(toEmit, errText, msgSize))
        {
          // <TBD> Probably should load a default msg here
        }

        //
        //  Create a LastExtEntityInfo structure and get the reader manager
        //  to fill it in for us. This will give us the information about
        //  the last reader on the stack that was an external entity of some
        //  sort (i.e. it will ignore internal entities.
        //
        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr->getLastExtEntityInfo(lastInfo);

        fErrorReporter->error
        (
            toEmit
            , XMLUni::fgValidityDomain
            , XMLValid::errorType(toEmit)
            , errText
            , lastInfo.systemId
            , lastInfo.publicId
            , lastInfo.lineNumber
            , lastInfo.colNumber
        );
    }

    // Bail out if its fatal an we are to give up on the first fatal error
    if (((XMLValid::isError(toEmit) && fScanner->getValidationConstraintFatal())
         || XMLValid::isFatal(toEmit))
    &&  fScanner->getExitOnFirstFatal()
    &&  !fScanner->getInException())
    {
        throw toEmit;
    }
}